

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block_graph.cpp
# Opt level: O0

bool IRT::isCJumpBasicBlock(CStatementList *basicBlock)

{
  vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
  *pvVar1;
  size_type sVar2;
  const_reference this;
  pointer pCVar3;
  long local_28;
  CStatement *lastStm;
  CStatementList *basicBlock_local;
  
  if (basicBlock == (CStatementList *)0x0) {
    __assert_fail("basicBlock != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/basic_blocks/basic_block_graph.cpp"
                  ,0x1c,"bool IRT::isCJumpBasicBlock(const CStatementList *)");
  }
  pvVar1 = CStatementList::Statements(basicBlock);
  sVar2 = std::
          vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
          ::size(pvVar1);
  if (sVar2 != 0) {
    pvVar1 = CStatementList::Statements(basicBlock);
    this = std::
           vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
           ::back(pvVar1);
    pCVar3 = std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
             get(this);
    if (pCVar3 == (pointer)0x0) {
      local_28 = 0;
    }
    else {
      local_28 = __dynamic_cast(pCVar3,&CStatement::typeinfo,&CJumpConditionalStatement::typeinfo,0)
      ;
    }
    return local_28 != 0;
  }
  __assert_fail("basicBlock->Statements().size() != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/basic_blocks/basic_block_graph.cpp"
                ,0x1d,"bool IRT::isCJumpBasicBlock(const CStatementList *)");
}

Assistant:

bool isCJumpBasicBlock(const CStatementList* basicBlock) {
        assert(basicBlock != nullptr);
        assert(basicBlock->Statements().size() != 0);
        const CStatement* lastStm = basicBlock->Statements().back().get();

        return dynamic_cast<const CJumpConditionalStatement*>(lastStm) != nullptr;
    }